

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

If_DsdMan_t * If_DsdManLoad(char *pFileName)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  void *pvVar6;
  If_DsdObj_t *pObj_00;
  int *__ptr;
  size_t sVar7;
  Vec_Wrd_t *pVVar8;
  word *__ptr_00;
  uint *local_80;
  int nBytes;
  FILE *pFile;
  int local_60;
  int RetValue;
  int Num2;
  int Num;
  int v;
  int i;
  word *pTruth;
  uint *pSpot;
  char pBuffer [10];
  Vec_Int_t *vSets;
  If_DsdObj_t *pObj;
  If_DsdMan_t *p;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Reading DSD manager file \"%s\" has failed.\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    fread((void *)((long)&pSpot + 6),4,1,__stream);
    iVar3 = strncmp((char *)((long)&pSpot + 6),"dsd1",4);
    if (iVar3 == 0) {
      fread(&RetValue,4,1,__stream);
      pFileName_local = (char *)If_DsdManAlloc(RetValue,0);
      if (((If_DsdMan_t *)pFileName_local)->pStore != (char *)0x0) {
        free(((If_DsdMan_t *)pFileName_local)->pStore);
        ((If_DsdMan_t *)pFileName_local)->pStore = (char *)0x0;
      }
      pcVar5 = Abc_UtilStrsav(pFileName);
      ((If_DsdMan_t *)pFileName_local)->pStore = pcVar5;
      fread(&RetValue,4,1,__stream);
      ((If_DsdMan_t *)pFileName_local)->LutSize = RetValue;
      pvVar6 = If_ManSatBuildXY(((If_DsdMan_t *)pFileName_local)->LutSize);
      ((If_DsdMan_t *)pFileName_local)->pSat = pvVar6;
      fread(&RetValue,4,1,__stream);
      if (RetValue < 2) {
        __assert_fail("Num >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                      ,0x46f,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      Vec_PtrFillExtra(&((If_DsdMan_t *)pFileName_local)->vObjs,RetValue,(void *)0x0);
      Vec_IntFill(&((If_DsdMan_t *)pFileName_local)->vNexts,RetValue,0);
      Vec_IntFill(&((If_DsdMan_t *)pFileName_local)->vTruths,RetValue,-1);
      iVar3 = Abc_PrimeCudd(RetValue << 1);
      ((If_DsdMan_t *)pFileName_local)->nBins = iVar3;
      if (((If_DsdMan_t *)pFileName_local)->pBins == (uint *)0x0) {
        local_80 = (uint *)malloc((long)((If_DsdMan_t *)pFileName_local)->nBins << 2);
      }
      else {
        local_80 = (uint *)realloc(((If_DsdMan_t *)pFileName_local)->pBins,
                                   (long)((If_DsdMan_t *)pFileName_local)->nBins << 2);
      }
      ((If_DsdMan_t *)pFileName_local)->pBins = local_80;
      memset(((If_DsdMan_t *)pFileName_local)->pBins,0,
             (long)((If_DsdMan_t *)pFileName_local)->nBins << 2);
      for (Num = 2; iVar3 = Num, iVar4 = Vec_PtrSize(&((If_DsdMan_t *)pFileName_local)->vObjs),
          iVar3 < iVar4; Num = Num + 1) {
        fread(&RetValue,4,1,__stream);
        pObj_00 = (If_DsdObj_t *)
                  Mem_FlexEntryFetch(((If_DsdMan_t *)pFileName_local)->pMem,RetValue << 3);
        fread(pObj_00,(long)RetValue << 3,1,__stream);
        Vec_PtrWriteEntry(&((If_DsdMan_t *)pFileName_local)->vObjs,Num,pObj_00);
        if ((*(uint *)&pObj_00->field_0x4 & 7) == 6) {
          fread(&RetValue,4,1,__stream);
          Vec_IntWriteEntry(&((If_DsdMan_t *)pFileName_local)->vTruths,Num,RetValue);
        }
        uVar1 = *(uint *)&pObj_00->field_0x4;
        uVar2 = *(uint *)&pObj_00->field_0x4;
        iVar3 = If_DsdObjTruthId((If_DsdMan_t *)pFileName_local,pObj_00);
        pTruth = (word *)If_DsdObjHashLookup((If_DsdMan_t *)pFileName_local,uVar1 & 7,
                                             (int *)(pObj_00 + 1),uVar2 >> 0x1b,iVar3);
        if ((uint)*pTruth != 0) {
          __assert_fail("*pSpot == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                        ,0x482,"If_DsdMan_t *If_DsdManLoad(char *)");
        }
        *(uint *)pTruth = pObj_00->Id;
      }
      iVar3 = ((If_DsdMan_t *)pFileName_local)->nUniqueMisses;
      iVar4 = Vec_PtrSize(&((If_DsdMan_t *)pFileName_local)->vObjs);
      if (iVar3 != iVar4 + -2) {
        __assert_fail("p->nUniqueMisses == Vec_PtrSize(&p->vObjs) - 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                      ,0x485,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      ((If_DsdMan_t *)pFileName_local)->nUniqueMisses = 0;
      _v = (word *)malloc((long)((If_DsdMan_t *)pFileName_local)->nWords << 3);
      for (Num2 = 3; Num2 <= ((If_DsdMan_t *)pFileName_local)->nVars; Num2 = Num2 + 1) {
        iVar3 = Vec_MemEntrySize(((If_DsdMan_t *)pFileName_local)->vTtMem[Num2]);
        fread(&RetValue,4,1,__stream);
        for (Num = 0; iVar4 = RetValue, Num < RetValue; Num = Num + 1) {
          fread(_v,(long)(iVar3 << 3),1,__stream);
          Vec_MemHashInsert(((If_DsdMan_t *)pFileName_local)->vTtMem[Num2],_v);
        }
        iVar3 = Vec_MemEntryNum(((If_DsdMan_t *)pFileName_local)->vTtMem[Num2]);
        if (iVar4 != iVar3) {
          __assert_fail("Num == Vec_MemEntryNum(p->vTtMem[v])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                        ,0x491,"If_DsdMan_t *If_DsdManLoad(char *)");
        }
        fread(&local_60,4,1,__stream);
        for (Num = 0; iVar3 = local_60, Num < local_60; Num = Num + 1) {
          fread(&RetValue,4,1,__stream);
          pBuffer._2_8_ = Vec_IntAlloc(RetValue);
          __ptr = Vec_IntArray((Vec_Int_t *)pBuffer._2_8_);
          fread(__ptr,(long)RetValue << 2,1,__stream);
          *(int *)(pBuffer._2_8_ + 4) = RetValue;
          Vec_PtrPush(((If_DsdMan_t *)pFileName_local)->vTtDecs[Num2],(void *)pBuffer._2_8_);
        }
        iVar4 = Vec_PtrSize(((If_DsdMan_t *)pFileName_local)->vTtDecs[Num2]);
        if (iVar3 != iVar4) {
          __assert_fail("Num2 == Vec_PtrSize(p->vTtDecs[v])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                        ,0x49b,"If_DsdMan_t *If_DsdManLoad(char *)");
        }
      }
      if (_v != (word *)0x0) {
        free(_v);
        _v = (word *)0x0;
      }
      fread(&RetValue,4,1,__stream);
      ((If_DsdMan_t *)pFileName_local)->nConfigWords = RetValue;
      fread(&RetValue,4,1,__stream);
      ((If_DsdMan_t *)pFileName_local)->nTtBits = RetValue;
      sVar7 = fread(&RetValue,4,1,__stream);
      if (((int)sVar7 != 0) && (RetValue != 0)) {
        pVVar8 = Vec_WrdStart(RetValue);
        ((If_DsdMan_t *)pFileName_local)->vConfigs = pVVar8;
        __ptr_00 = Vec_WrdArray(((If_DsdMan_t *)pFileName_local)->vConfigs);
        fread(__ptr_00,(long)RetValue << 3,1,__stream);
      }
      sVar7 = fread(&RetValue,4,1,__stream);
      if (((int)sVar7 != 0) && (RetValue != 0)) {
        pcVar5 = (char *)calloc((long)(RetValue + 1),1);
        ((If_DsdMan_t *)pFileName_local)->pCellStr = pcVar5;
        fread(((If_DsdMan_t *)pFileName_local)->pCellStr,(long)RetValue,1,__stream);
      }
      fclose(__stream);
    }
    else {
      printf("Unrecognized format of file \"%s\".\n",pFileName);
      pFileName_local = (char *)0x0;
    }
  }
  return (If_DsdMan_t *)pFileName_local;
}

Assistant:

If_DsdMan_t * If_DsdManLoad( char * pFileName )
{
    If_DsdMan_t * p;
    If_DsdObj_t * pObj; 
    Vec_Int_t * vSets;
    char pBuffer[10];
    unsigned * pSpot;
    word * pTruth;
    int i, v, Num, Num2, RetValue;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Reading DSD manager file \"%s\" has failed.\n", pFileName );
        return NULL;
    }
    RetValue = fread( pBuffer, 4, 1, pFile );
    if ( strncmp(pBuffer, DSD_VERSION, strlen(DSD_VERSION)) )
    {
        printf( "Unrecognized format of file \"%s\".\n", pFileName );
        return NULL;
    }
    RetValue = fread( &Num, 4, 1, pFile );
    p = If_DsdManAlloc( Num, 0 );
    ABC_FREE( p->pStore );
    p->pStore = Abc_UtilStrsav( pFileName );
    RetValue = fread( &Num, 4, 1, pFile );
    p->LutSize = Num;
    p->pSat  = If_ManSatBuildXY( p->LutSize );
    RetValue = fread( &Num, 4, 1, pFile );
    assert( Num >= 2 );
    Vec_PtrFillExtra( &p->vObjs, Num, NULL );
    Vec_IntFill( &p->vNexts, Num, 0 );
    Vec_IntFill( &p->vTruths, Num, -1 );
    p->nBins = Abc_PrimeCudd( 2*Num );
    p->pBins = ABC_REALLOC( unsigned, p->pBins, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned) * p->nBins );
    for ( i = 2; i < Vec_PtrSize(&p->vObjs); i++ )
    {
        RetValue = fread( &Num, 4, 1, pFile );
        pObj = (If_DsdObj_t *)Mem_FlexEntryFetch( p->pMem, sizeof(word) * Num );
        RetValue = fread( pObj, sizeof(word)*Num, 1, pFile );
        Vec_PtrWriteEntry( &p->vObjs, i, pObj );
        if ( pObj->Type == IF_DSD_PRIME )
        {
            RetValue = fread( &Num, 4, 1, pFile );
            Vec_IntWriteEntry( &p->vTruths, i, Num );
        }
        pSpot = If_DsdObjHashLookup( p, pObj->Type, (int *)pObj->pFans, pObj->nFans, If_DsdObjTruthId(p, pObj) );
        assert( *pSpot == 0 );
        *pSpot = pObj->Id;
    }
    assert( p->nUniqueMisses == Vec_PtrSize(&p->vObjs) - 2 );
    p->nUniqueMisses = 0;
    pTruth = ABC_ALLOC( word, p->nWords );
    for ( v = 3; v <= p->nVars; v++ )
    {
        int nBytes = sizeof(word)*Vec_MemEntrySize(p->vTtMem[v]);
        RetValue = fread( &Num, 4, 1, pFile );
        for ( i = 0; i < Num; i++ )
        {
            RetValue = fread( pTruth, nBytes, 1, pFile );
            Vec_MemHashInsert( p->vTtMem[v], pTruth );
        }
        assert( Num == Vec_MemEntryNum(p->vTtMem[v]) );
        RetValue = fread( &Num2, 4, 1, pFile );
        for ( i = 0; i < Num2; i++ )
        {
            RetValue = fread( &Num, 4, 1, pFile );
            vSets = Vec_IntAlloc( Num );
            RetValue = fread( Vec_IntArray(vSets), sizeof(int)*Num, 1, pFile );
            vSets->nSize = Num;
            Vec_PtrPush( p->vTtDecs[v], vSets );
        }
        assert( Num2 == Vec_PtrSize(p->vTtDecs[v]) ); 
    }
    ABC_FREE( pTruth );
    RetValue = fread( &Num, 4, 1, pFile );
    p->nConfigWords = Num;
    RetValue = fread( &Num, 4, 1, pFile );
    p->nTtBits = Num;
    RetValue = fread( &Num, 4, 1, pFile );
    if ( RetValue && Num )
    {
        p->vConfigs = Vec_WrdStart( Num );
        RetValue = fread( Vec_WrdArray(p->vConfigs), sizeof(word)*Num, 1, pFile );
    }
    RetValue = fread( &Num, 4, 1, pFile );
    if ( RetValue && Num )
    {
        p->pCellStr = ABC_CALLOC( char, Num + 1 );
        RetValue = fread( p->pCellStr, sizeof(char)*Num, 1, pFile );
    }
    fclose( pFile );
    return p;
}